

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Mio_Gate_t **ppMVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  Mio_Gate_t *pMVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  int local_4c;
  
  if ((fUseLibrary != 0) && (pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar4 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar8 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar17 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      uVar16 = 0;
      do {
        Mio_GateSetValue(ppMVar8[uVar16],0);
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    pVVar9 = pNtk->vObjs;
    if (pVVar9->nSize < 1) {
      uVar15 = 0;
    }
    else {
      uVar19 = 0;
      uVar15 = 0;
      do {
        if ((int)uVar19 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar10 = (Abc_Obj_t *)pVVar9->pArray[uVar19];
        if ((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) {
          bVar20 = false;
          if (pAVar10->pNtk->ntkFunc == ABC_FUNC_MAP) {
            if ((pAVar10->vFanins).nSize == 1) {
              bVar20 = (pAVar10->field_5).pData == (void *)0x0;
            }
            else {
              bVar20 = false;
            }
          }
          if ((uVar19 != 0) && (!bVar20)) {
            pMVar11 = (Mio_Gate_t *)(pAVar10->field_5).pData;
            iVar5 = Mio_GateReadValue(pMVar11);
            Mio_GateSetValue(pMVar11,iVar5 + 1);
            uVar15 = uVar15 + 1;
            pAVar10 = Abc_NtkFetchTwinNode(pAVar10);
            uVar19 = (uVar19 + 1) - (uint)(pAVar10 == (Abc_Obj_t *)0x0);
          }
        }
        uVar19 = uVar19 + 1;
        pVVar9 = pNtk->vObjs;
      } while ((int)uVar19 < pVVar9->nSize);
    }
    uVar19 = 5;
    if (0 < (int)uVar4) {
      uVar16 = 0;
      do {
        iVar5 = Mio_GateReadValue(ppMVar8[uVar16]);
        uVar7 = uVar19;
        if (iVar5 != 0) {
          pcVar12 = Mio_GateReadName(ppMVar8[uVar16]);
          sVar13 = strlen(pcVar12);
          uVar7 = (uint)sVar13;
          if ((int)(uint)sVar13 < (int)uVar19) {
            uVar7 = uVar19;
          }
        }
        uVar19 = uVar7;
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    dVar22 = Abc_NtkGetMappedArea(pNtk);
    if (0 < (int)uVar4) {
      uVar16 = 0;
      do {
        uVar4 = Mio_GateReadValue(ppMVar8[uVar16]);
        if (uVar4 != 0) {
          dVar23 = Mio_GateReadArea(ppMVar8[uVar16]);
          pcVar12 = Mio_GateReadName(ppMVar8[uVar16]);
          uVar7 = Mio_GateReadPinNum(ppMVar8[uVar16]);
          pcVar14 = Mio_GateReadForm(ppMVar8[uVar16]);
          printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                 dVar23 * (double)(int)uVar4,(dVar23 * (double)(int)uVar4 * 100.0) / dVar22,
                 (ulong)uVar19,pcVar12,(ulong)uVar7,(ulong)uVar4,pcVar14);
        }
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",dVar22,
           0x4059000000000000,(ulong)uVar19,"TOTAL",(ulong)uVar15);
    return;
  }
  if (pNtk->ntkFunc == ABC_FUNC_BDD) {
    bVar20 = pNtk->ntkType != ABC_NTK_LOGIC;
  }
  else {
    bVar20 = true;
    if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      return;
    }
  }
  if ((!bVar20) && (iVar5 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar5 == 0)) {
    puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
    return;
  }
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize < 1) {
    iVar5 = 0;
    iVar1 = 0;
    iVar2 = 0;
    local_4c = 0;
    uVar4 = 0;
    uVar15 = 0;
    uVar19 = 0;
  }
  else {
    lVar18 = 0;
    uVar19 = 0;
    uVar15 = 0;
    uVar4 = 0;
    local_4c = 0;
    iVar2 = 0;
    iVar1 = 0;
    iVar5 = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar18];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        bVar21 = false;
        if (*(int *)(*plVar3 + 4) == 4) {
          if (*(int *)((long)plVar3 + 0x1c) == 1) {
            bVar21 = plVar3[7] == 0;
          }
          else {
            bVar21 = false;
          }
        }
        if ((lVar18 != 0) && (!bVar21)) {
          pMVar11 = (Mio_Gate_t *)plVar3[7];
          if (pNtk->ntkFunc == ABC_FUNC_MAP) {
            pMVar11 = (Mio_Gate_t *)Mio_GateReadSop(pMVar11);
          }
          iVar6 = Abc_SopIsConst0((char *)pMVar11);
          if ((iVar6 == 0) && (iVar6 = Abc_SopIsConst1((char *)pMVar11), iVar6 == 0)) {
            iVar6 = Abc_SopIsBuf((char *)pMVar11);
            if (iVar6 == 0) {
              iVar6 = Abc_SopIsInv((char *)pMVar11);
              if (iVar6 == 0) {
                iVar6 = Abc_SopIsComplement((char *)pMVar11);
                if (((iVar6 == 0) && (iVar6 = Abc_SopIsAndType((char *)pMVar11), iVar6 != 0)) ||
                   ((iVar6 = Abc_SopIsComplement((char *)pMVar11), iVar6 != 0 &&
                    (iVar6 = Abc_SopIsOrType((char *)pMVar11), iVar6 != 0)))) {
                  iVar1 = iVar1 + 1;
                }
                else {
                  iVar6 = Abc_SopIsComplement((char *)pMVar11);
                  if (((iVar6 == 0) || (iVar6 = Abc_SopIsAndType((char *)pMVar11), iVar6 == 0)) &&
                     ((iVar6 = Abc_SopIsComplement((char *)pMVar11), iVar6 != 0 ||
                      (iVar6 = Abc_SopIsOrType((char *)pMVar11), iVar6 == 0)))) {
                    local_4c = local_4c + 1;
                  }
                  else {
                    iVar2 = iVar2 + 1;
                  }
                }
              }
              else {
                iVar5 = iVar5 + 1;
              }
            }
            else {
              uVar15 = uVar15 + 1;
            }
          }
          else {
            uVar19 = uVar19 + 1;
          }
          uVar4 = uVar4 + 1;
        }
      }
      lVar18 = lVar18 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar18 < pVVar9->nSize);
  }
  dVar22 = (double)(int)uVar4;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar19 * 100.0) / dVar22,(ulong)uVar19);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar15 * 100.0) / dVar22,(ulong)uVar15);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar5 * 100.0) / dVar22);
  printf("And          = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar22);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar2 * 100.0) / dVar22);
  printf("Other        = %8d    %6.2f %%\n",((double)local_4c * 100.0) / dVar22);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar22 * 100.0) / dVar22,(ulong)uVar4);
  if (bVar20) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
            Mio_GateSetValue( ppGates[i], 0 );

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0 );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}